

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_dc_left_predictor_64x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  int iVar2;
  undefined1 (*pauVar3) [32];
  bool bVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  
  auVar5 = vpsadbw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),*(undefined1 (*) [32])left);
  auVar1 = vpermq_avx2(auVar5,0x4e);
  auVar5 = vpaddq_avx2(auVar1,auVar5);
  auVar1 = vpshufd_avx2(auVar5,0xee);
  auVar6._8_2_ = 0x10;
  auVar6._0_8_ = 0x10001000100010;
  auVar6._10_2_ = 0x10;
  auVar6._12_2_ = 0x10;
  auVar6._14_2_ = 0x10;
  auVar6._16_2_ = 0x10;
  auVar6._18_2_ = 0x10;
  auVar6._20_2_ = 0x10;
  auVar6._22_2_ = 0x10;
  auVar6._24_2_ = 0x10;
  auVar6._26_2_ = 0x10;
  auVar6._28_2_ = 0x10;
  auVar6._30_2_ = 0x10;
  auVar5 = vpaddw_avx2(auVar5,auVar6);
  auVar5 = vpaddw_avx2(auVar5,auVar1);
  auVar5 = vpsrlw_avx2(auVar5,5);
  auVar5 = vpshufb_avx2(auVar5,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  pauVar3 = (undefined1 (*) [32])(dst + 0x20);
  iVar2 = 0x20;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    pauVar3[-1] = auVar5;
    *pauVar3 = auVar5;
    pauVar3 = (undefined1 (*) [32])(*pauVar3 + stride);
  }
  return;
}

Assistant:

static inline __m256i dc_sum_32(const uint8_t *ref) {
  const __m256i x = _mm256_loadu_si256((const __m256i *)ref);
  const __m256i zero = _mm256_setzero_si256();
  __m256i y = _mm256_sad_epu8(x, zero);
  __m256i u = _mm256_permute2x128_si256(y, y, 1);
  y = _mm256_add_epi64(u, y);
  u = _mm256_unpackhi_epi64(y, y);
  return _mm256_add_epi16(y, u);
}